

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O2

agent_queue_t * __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
::pop_agent_queue(work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
                  *this)

{
  agent_queue_t *paVar1;
  
  paVar1 = reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>::pop
                     (*(mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t> **)this,
                      *(condition_t **)(this + 0x18));
  return paVar1;
}

Assistant:

agent_queue_t *
		pop_agent_queue() SO_5_NOEXCEPT
			{
				agent_queue_t * result = nullptr;

				this->wait_started();

				result = this->m_disp_queue->pop( *(this->m_condition) );

				this->wait_finished();

				return result;
			}